

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O2

size_t anon_unknown.dwarf_13feb99::countMaxConsecutiveEqualSigns(string *name)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  undefined1 local_1a;
  undefined1 local_19;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_19 = 0x3d;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar1,pcVar1 + name->_M_string_length);
  uVar8 = 0;
  do {
    pcVar4 = (name->_M_dataplus)._M_p + name->_M_string_length;
    if (_Var2._M_current == pcVar4) {
      return uVar8;
    }
    lVar3 = 0;
    for (lVar5 = (long)(pcVar4 + ~(ulong)_Var2._M_current) >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
      if (_Var2._M_current[lVar3 + 1] != '=') {
        pcVar6 = _Var2._M_current + lVar3 + 1;
        goto LAB_003a2325;
      }
      if (_Var2._M_current[lVar3 + 2] != '=') {
        pcVar6 = _Var2._M_current + lVar3 + 2;
        goto LAB_003a2325;
      }
      if (_Var2._M_current[lVar3 + 3] != '=') {
        pcVar6 = _Var2._M_current + lVar3 + 3;
        goto LAB_003a2325;
      }
      if (_Var2._M_current[lVar3 + 4] != '=') {
        pcVar6 = _Var2._M_current + lVar3 + 4;
        goto LAB_003a2325;
      }
      lVar3 = lVar3 + 4;
    }
    pcVar7 = _Var2._M_current + lVar3 + 1;
    lVar5 = (long)(pcVar4 + ~(ulong)_Var2._M_current) - lVar3;
    if (lVar5 == 1) {
LAB_003a231a:
      pcVar6 = pcVar7;
      if (*pcVar7 == '=') {
        pcVar6 = pcVar4;
      }
    }
    else if (lVar5 == 3) {
      pcVar6 = pcVar7;
      if (*pcVar7 == '=') {
        pcVar7 = _Var2._M_current + lVar3 + 2;
        goto LAB_003a2311;
      }
    }
    else {
      pcVar6 = pcVar4;
      if (lVar5 == 2) {
LAB_003a2311:
        pcVar6 = pcVar7;
        if (*pcVar7 == '=') {
          pcVar7 = pcVar7 + 1;
          goto LAB_003a231a;
        }
      }
    }
LAB_003a2325:
    if (uVar8 <= (ulong)((long)pcVar6 - (long)_Var2._M_current)) {
      uVar8 = (long)pcVar6 - (long)_Var2._M_current;
    }
    local_1a = 0x3d;
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar6,pcVar4,&local_1a);
  } while( true );
}

Assistant:

std::size_t countMaxConsecutiveEqualSigns(const std::string& name)
{
  std::size_t max = 0;
  auto startIt = find(name.begin(), name.end(), '=');
  auto endIt = startIt;
  for (; startIt != name.end(); startIt = find(endIt, name.end(), '=')) {
    endIt =
      find_if_not(startIt + 1, name.end(), [](char c) { return c == '='; });
    max =
      std::max(max, static_cast<std::size_t>(std::distance(startIt, endIt)));
  }
  return max;
}